

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  String *rhs;
  int *piVar1;
  Enum EVar2;
  undefined8 *puVar3;
  byte bVar4;
  bool bVar5;
  char *pcVar6;
  size_type sVar7;
  IReporter **curr_rep;
  long lVar8;
  undefined8 *puVar9;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  uint extraout_XMM0_Da_01;
  uint extraout_XMM0_Da_02;
  uint extraout_XMM0_Da_03;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  anon_union_24_2_13149d16_for_String_3 local_78;
  anon_union_24_2_13149d16_for_String_3 local_60;
  anon_union_24_2_13149d16_for_String_3 local_48;
  anon_union_24_2_13149d16_for_String_3 local_30;
  
  EVar2 = (this->super_AssertData).m_at;
  if ((EVar2 & is_throws) == 0) {
    if ((~EVar2 & 0x60) == 0) {
      bVar4 = true;
      if ((this->super_AssertData).m_threw_as == true) {
LAB_0010d400:
        bVar4 = AssertData::StringContains::check
                          (&(this->super_AssertData).m_exception_string,
                           &(this->super_AssertData).m_exception);
        __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        goto LAB_0010d412;
      }
    }
    else {
      if ((EVar2 & is_throws_as) != 0) {
        bVar4 = (this->super_AssertData).m_threw_as;
        goto LAB_0010d412;
      }
      if ((EVar2 & is_throws_with) != 0) goto LAB_0010d400;
      if (-1 < (char)EVar2) goto LAB_0010d417;
      bVar4 = (this->super_AssertData).m_threw;
    }
  }
  else {
    bVar4 = (this->super_AssertData).m_threw;
LAB_0010d412:
    bVar4 = bVar4 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar4;
LAB_0010d417:
  bVar4 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar4 < '\0') {
    sVar7 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    sVar7 = 0x17 - (bVar4 & 0x1f);
  }
  if (sVar7 != 0) {
    rhs = &(this->super_AssertData).m_exception;
    pcVar6 = String::allocate((String *)&local_30.data,1);
    *pcVar6 = '\"';
    operator+((String *)&local_48.data,(String *)&local_30.data,rhs);
    pcVar6 = String::allocate((String *)&local_60.data,1);
    *pcVar6 = '\"';
    operator+((String *)&local_78.data,(String *)&local_48.data,(String *)&local_60.data);
    uVar10 = extraout_XMM0_Da_00;
    uVar11 = extraout_XMM0_Db_00;
    if (&rhs->field_0 != &local_78) {
      if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
         (pcVar6 = (rhs->field_0).data.ptr, pcVar6 != (char *)0x0)) {
        operator_delete__(pcVar6);
      }
      uVar10 = local_78._0_4_;
      *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
           CONCAT17(local_78.buf[0x17],local_78._16_7_);
      *(undefined4 *)&rhs->field_0 = local_78._0_4_;
      *(undefined4 *)((long)&(this->super_AssertData).m_exception.field_0 + 4) = local_78._4_4_;
      (this->super_AssertData).m_exception.field_0.data.size = local_78.data.size;
      (this->super_AssertData).m_exception.field_0.data.capacity = local_78.data.capacity;
      local_78._0_4_ = local_78._0_4_ & 0xffffff00;
      local_78.buf[0x17] = '\x17';
      uVar11 = local_78._4_4_;
    }
    if ((local_78.buf[0x17] < '\0') &&
       ((void *)CONCAT44(local_78._4_4_,local_78._0_4_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT44(local_78._4_4_,local_78._0_4_));
      uVar10 = extraout_XMM0_Da_01;
      uVar11 = extraout_XMM0_Db_01;
    }
    if ((local_60.buf[0x17] < '\0') && (local_60.data.ptr != (char *)0x0)) {
      operator_delete__(local_60.data.ptr);
      uVar10 = extraout_XMM0_Da_02;
      uVar11 = extraout_XMM0_Db_02;
    }
    if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
      operator_delete__(local_48.data.ptr);
      uVar10 = extraout_XMM0_Da_03;
      uVar11 = extraout_XMM0_Db_03;
    }
    __x = (double)CONCAT44(uVar11,uVar10);
    if ((local_30.buf[0x17] < '\0') &&
       (__x = (double)CONCAT44(uVar11,uVar10), local_30.data.ptr != (char *)0x0)) {
      operator_delete__(local_30.data.ptr);
      __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
    }
  }
  if (is_running_in_test == '\x01') {
    if (((this->super_AssertData).m_at & is_warn) == 0) {
      lVar8 = g_cs + 0xb8;
      if (*(char *)(in_FS_OFFSET + -8) == '\0') {
        __x = log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar8 + *(long *)(in_FS_OFFSET + -0x10) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar3 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar9 = *(undefined8 **)(g_cs + 0x10d0); puVar9 != puVar3; puVar9 = puVar9 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar9 + 0x48))((long *)*puVar9,this);
    }
    if (((this->super_AssertData).m_failed != false) &&
       (((this->super_AssertData).m_at & is_warn) == 0)) {
      lVar8 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -8) == '\0') {
        __x = log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar8 + *(long *)(in_FS_OFFSET + -0x10) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    __x = (double)(**(code **)(g_cs + 0x10e8))(this);
  }
  if ((this->super_AssertData).m_failed == true) {
    bVar5 = isDebuggerActive();
    __x = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
    if (bVar5) {
      __x = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
    }
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || !m_exception_string.check(m_exception);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = !m_exception_string.check(m_exception);
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }